

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O1

void __thiscall
vk::DescriptorSetUpdateBuilder::update
          (DescriptorSetUpdateBuilder *this,DeviceInterface *vk,VkDevice device)

{
  pointer pVVar1;
  pointer pVVar2;
  long lVar3;
  pointer *ppHVar4;
  VkBufferView **ppVVar5;
  ulong uVar6;
  pointer pVVar7;
  vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> writes;
  vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> local_30;
  
  std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::vector
            (&local_30,&this->m_writes);
  pVVar7 = (this->m_writes).
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (this->m_writes).
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pVVar1 - (long)pVVar7;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 6;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    ppHVar4 = &(((this->m_writeDescriptorInfos).
                 super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start)->texelBufferViews).
               super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppVVar5 = &(local_30.
                super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_start)->pTexelBufferView;
    do {
      if ((VkDescriptorImageInfo *)ppHVar4[-7] != (VkDescriptorImageInfo *)ppHVar4[-6]) {
        ppVVar5[-2] = (VkBufferView *)ppHVar4[-7];
      }
      if ((VkDescriptorBufferInfo *)ppHVar4[-4] != (VkDescriptorBufferInfo *)ppHVar4[-3]) {
        ppVVar5[-1] = (VkBufferView *)ppHVar4[-4];
      }
      if (((_Vector_impl_data *)(ppHVar4 + -1))->_M_start != *ppHVar4) {
        *ppVVar5 = ((_Vector_impl_data *)(ppHVar4 + -1))->_M_start;
      }
      ppHVar4 = ppHVar4 + 9;
      ppVVar5 = ppVVar5 + 8;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  pVVar2 = local_30.
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar7 == pVVar1) {
    pVVar2 = (pointer)0x0;
  }
  pVVar7 = (pointer)(this->m_copies).
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(this->m_copies).
                super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar7;
  if (uVar6 == 0) {
    pVVar7 = (pointer)0x0;
  }
  (*vk->_vptr_DeviceInterface[0x3e])
            (vk,device,
             (ulong)((long)local_30.
                           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_30.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 6,pVVar2,
             (ulong)(uint)((int)(uVar6 >> 3) * -0x49249249),pVVar7);
  if (local_30.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DescriptorSetUpdateBuilder::update (const DeviceInterface& vk, VkDevice device) const
{
	// Update VkWriteDescriptorSet structures with stored info
	std::vector<VkWriteDescriptorSet> writes	= m_writes;

	for (size_t writeNdx = 0; writeNdx < m_writes.size(); writeNdx++)
	{
		const WriteDescriptorInfo& writeInfo = m_writeDescriptorInfos[writeNdx];

		if (!writeInfo.imageInfos.empty())
			writes[writeNdx].pImageInfo			= &writeInfo.imageInfos[0];

		if (!writeInfo.bufferInfos.empty())
			writes[writeNdx].pBufferInfo		= &writeInfo.bufferInfos[0];

		if (!writeInfo.texelBufferViews.empty())
			writes[writeNdx].pTexelBufferView	= &writeInfo.texelBufferViews[0];
	}

	const VkWriteDescriptorSet* const	writePtr	= (m_writes.empty()) ? (DE_NULL) : (&writes[0]);
	const VkCopyDescriptorSet* const	copyPtr		= (m_copies.empty()) ? (DE_NULL) : (&m_copies[0]);

	vk.updateDescriptorSets(device, (deUint32)writes.size(), writePtr, (deUint32)m_copies.size(), copyPtr);
}